

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O0

token __thiscall
wigwag::token::
create<wigwag::detail::listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>::handler_node,wigwag::detail::intrusive_ptr<wigwag::detail::listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>>&,std::function<void()>>
          (token *this,
          intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
          *args,function<void_()> *args_1)

{
  handler_node *this_00;
  function<void_()> local_58;
  intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  local_28;
  function<void_()> *local_20;
  function<void_()> *args_local_1;
  intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  *args_local;
  
  local_20 = args_1;
  args_local_1 = (function<void_()> *)args;
  args_local = (intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
                *)this;
  this_00 = (handler_node *)operator_new(0x50);
  wigwag::detail::
  intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  ::intrusive_ptr(&local_28,
                  (intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
                   *)args_local_1);
  std::function<void_()>::function(&local_58,local_20);
  wigwag::detail::
  listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  ::handler_node::handler_node(this_00,&local_28,&local_58);
  token(this,(implementation *)this_00);
  std::function<void_()>::~function(&local_58);
  wigwag::detail::
  intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  ::~intrusive_ptr(&local_28);
  return (token)(implementation *)this;
}

Assistant:

static token create(Args_&&... args)
        { return token(new Implementation_(std::forward<Args_>(args)...)); }